

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

void __thiscall
zmq::endpoint_uri_pair_t::endpoint_uri_pair_t
          (endpoint_uri_pair_t *this,string *local,string *remote,endpoint_type_t local_type)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  *(undefined4 *)(in_RDI + 0x40) = in_ECX;
  return;
}

Assistant:

endpoint_uri_pair_t (const std::string &local,
                         const std::string &remote,
                         endpoint_type_t local_type) :
        local (local),
        remote (remote),
        local_type (local_type)
    {
    }